

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O0

void __thiscall
cmMakefileProfilingData::StartEntry
          (cmMakefileProfilingData *this,cmListFileFunction *lff,cmListFileContext *lfc)

{
  bool bVar1;
  char cVar2;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *pvVar3;
  Value *pVVar4;
  string *name;
  char *str;
  optional<Json::Value> local_270;
  allocator<char> local_239;
  string local_238;
  string local_218;
  cmAlphaNum local_1f8;
  cmAlphaNum local_1c8;
  string local_198;
  Value local_178;
  Value local_150;
  cmAlphaNum local_128;
  cmAlphaNum local_e8;
  string local_b8;
  reference local_98;
  cmListFileArgument *a;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range2;
  string args;
  undefined1 local_50 [8];
  optional<Json::Value> argsValue;
  cmListFileContext *lfc_local;
  cmListFileFunction *lff_local;
  cmMakefileProfilingData *this_local;
  
  args.field_2._8_4_ = 7;
  argsValue.super__Optional_base<Json::Value,_false,_false>._M_payload.
  super__Optional_payload<Json::Value,_true,_false,_false>.super__Optional_payload_base<Json::Value>
  ._40_8_ = lfc;
  std::optional<Json::Value>::optional<Json::ValueType,_false>
            ((optional<Json::Value> *)local_50,(undefined1 *)((long)&args.field_2 + 8));
  pvVar3 = cmListFileFunction::Arguments(lff);
  bVar1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::empty(pvVar3);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&__range2);
    pvVar3 = cmListFileFunction::Arguments(lff);
    __end2 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(pvVar3);
    a = (cmListFileArgument *)
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(pvVar3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                  *)&a);
      if (!bVar1) break;
      local_98 = __gnu_cxx::
                 __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                 ::operator*(&__end2);
      cmAlphaNum::cmAlphaNum(&local_e8,(string *)&__range2);
      cVar2 = std::__cxx11::string::empty();
      str = " ";
      if (cVar2 != '\0') {
        str = "";
      }
      cmAlphaNum::cmAlphaNum(&local_128,str);
      cmStrCat<std::__cxx11::string>(&local_b8,&local_e8,&local_128,&local_98->Value);
      std::__cxx11::string::operator=((string *)&__range2,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      __gnu_cxx::
      __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
      ::operator++(&__end2);
    }
    Json::Value::Value(&local_150,(String *)&__range2);
    pVVar4 = std::optional<Json::Value>::operator*((optional<Json::Value> *)local_50);
    pVVar4 = Json::Value::operator[](pVVar4,"functionArgs");
    Json::Value::operator=(pVVar4,&local_150);
    Json::Value::~Value(&local_150);
    std::__cxx11::string::~string((string *)&__range2);
  }
  cmAlphaNum::cmAlphaNum
            (&local_1c8,
             (string *)
             (argsValue.super__Optional_base<Json::Value,_false,_false>._M_payload.
              super__Optional_payload<Json::Value,_true,_false,_false>.
              super__Optional_payload_base<Json::Value>._40_8_ + 0x20));
  cmAlphaNum::cmAlphaNum(&local_1f8,':');
  std::__cxx11::to_string
            (&local_218,
             *(long *)(argsValue.super__Optional_base<Json::Value,_false,_false>._M_payload.
                       super__Optional_payload<Json::Value,_true,_false,_false>.
                       super__Optional_payload_base<Json::Value>._40_8_ + 0x40));
  cmStrCat<std::__cxx11::string>(&local_198,&local_1c8,&local_1f8,&local_218);
  Json::Value::Value(&local_178,&local_198);
  pVVar4 = std::optional<Json::Value>::operator*((optional<Json::Value> *)local_50);
  pVVar4 = Json::Value::operator[](pVVar4,"location");
  Json::Value::operator=(pVVar4,&local_178);
  Json::Value::~Value(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"script",&local_239);
  name = cmListFileFunction::LowerCaseName_abi_cxx11_(lff);
  std::optional<Json::Value>::optional(&local_270,(optional<Json::Value> *)local_50);
  StartEntry(this,&local_238,name,&local_270);
  std::optional<Json::Value>::~optional(&local_270);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::optional<Json::Value>::~optional((optional<Json::Value> *)local_50);
  return;
}

Assistant:

void cmMakefileProfilingData::StartEntry(const cmListFileFunction& lff,
                                         cmListFileContext const& lfc)
{
  cm::optional<Json::Value> argsValue(cm::in_place, Json::objectValue);
  if (!lff.Arguments().empty()) {
    std::string args;
    for (auto const& a : lff.Arguments()) {
      args = cmStrCat(args, args.empty() ? "" : " ", a.Value);
    }
    (*argsValue)["functionArgs"] = args;
  }
  (*argsValue)["location"] =
    cmStrCat(lfc.FilePath, ':', std::to_string(lfc.Line));
  this->StartEntry("script", lff.LowerCaseName(), std::move(argsValue));
}